

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,char *type)

{
  pointer plVar1;
  layer_creator_func UNRECOVERED_JUMPTABLE;
  uint uVar2;
  Layer *pLVar3;
  
  uVar2 = custom_layer_to_index(this,type);
  if ((uVar2 != 0xffffffff) && (-1 < (int)uVar2)) {
    plVar1 = (this->custom_layer_registry).
             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((int)uVar2 <
         (int)((ulong)((long)(this->custom_layer_registry).
                             super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)plVar1) >> 4)) &&
       (UNRECOVERED_JUMPTABLE = plVar1[uVar2].creator,
       UNRECOVERED_JUMPTABLE != (layer_creator_func)0x0)) {
      pLVar3 = (*UNRECOVERED_JUMPTABLE)();
      return pLVar3;
    }
  }
  return (Layer *)0x0;
}

Assistant:

Layer* Net::create_custom_layer(const char* type)
{
    int index = custom_layer_to_index(type);
    if (index == -1)
        return 0;

    return create_custom_layer(index);
}